

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O1

void Eigen::internal::gemv_selector<2,0,true>::
     run<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>const>,4>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,false>>
               (GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>
                *prod,Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false> *dest,
               Scalar *alpha)

{
  ulong uVar1;
  double *rhs;
  Nested pMVar2;
  double *lhs;
  long rows;
  long cols;
  long lhsStride;
  long rhsIncr;
  Scalar in_RAX;
  PointerType pdVar3;
  undefined8 *puVar4;
  Scalar *pSVar5;
  PointerType __ptr;
  Scalar SVar6;
  Scalar local_38;
  
  pSVar5 = &local_38;
  uVar1 = (dest->
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
          m_rows.m_value;
  local_38 = in_RAX;
  if (uVar1 >> 0x3d == 0) {
    rhs = (prod->
          super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
          ).m_rhs.m_matrix.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
          m_data;
    pMVar2 = (prod->
             super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
             ).m_rhs.m_matrix.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
             m_xpr;
    local_38 = *alpha;
    pdVar3 = (dest->
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>).
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
             m_data;
    SVar6 = local_38;
    if (pdVar3 == (PointerType)0x0) {
      if (uVar1 < 0x4001) {
        pdVar3 = (PointerType)((long)&local_38 - (uVar1 * 8 + 0xf & 0xfffffffffffffff0));
        pSVar5 = pdVar3;
        __ptr = pdVar3;
        local_38 = in_RAX;
      }
      else {
        pdVar3 = (PointerType)malloc(uVar1 * 8);
        __ptr = pdVar3;
        SVar6 = local_38;
        if (pdVar3 == (PointerType)0x0) goto LAB_0010a0b1;
      }
    }
    else {
      pSVar5 = &local_38;
      __ptr = (PointerType)0x0;
      local_38 = in_RAX;
    }
    lhs = (prod->
          super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
          ).m_lhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_data;
    rows = (prod->
           super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
           ).m_lhs.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_rows.m_value;
    cols = (prod->
           super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
           ).m_lhs.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_cols.m_value;
    lhsStride = (prod->
                super_ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_4>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                ).m_lhs.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                .m_outerStride;
    rhsIncr = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
    pSVar5[-1] = 4.94065645841247e-324;
    pSVar5[-2] = (Scalar)pdVar3;
    pSVar5[-3] = 5.38371970763352e-318;
    general_matrix_vector_product<long,_double,_0,_false,_double,_false,_0>::run
              (rows,cols,lhs,lhsStride,rhs,rhsIncr,(ResScalar *)pSVar5[-2],(long)pSVar5[-1],SVar6);
    if (0x4000 < uVar1) {
      pSVar5[-1] = 5.38382346141915e-318;
      free(__ptr);
    }
    return;
  }
LAB_0010a0b1:
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = operator_delete;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static inline void run(const ProductType& prod, Dest& dest, const typename ProductType::Scalar& alpha)
  {
    typedef typename ProductType::Index Index;
    typedef typename ProductType::LhsScalar   LhsScalar;
    typedef typename ProductType::RhsScalar   RhsScalar;
    typedef typename ProductType::Scalar      ResScalar;
    typedef typename ProductType::RealScalar  RealScalar;
    typedef typename ProductType::ActualLhsType ActualLhsType;
    typedef typename ProductType::ActualRhsType ActualRhsType;
    typedef typename ProductType::LhsBlasTraits LhsBlasTraits;
    typedef typename ProductType::RhsBlasTraits RhsBlasTraits;
    typedef Map<Matrix<ResScalar,Dynamic,1>, Aligned> MappedDest;

    ActualLhsType actualLhs = LhsBlasTraits::extract(prod.lhs());
    ActualRhsType actualRhs = RhsBlasTraits::extract(prod.rhs());

    ResScalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(prod.lhs())
                                  * RhsBlasTraits::extractScalarFactor(prod.rhs());

    // make sure Dest is a compile-time vector type (bug 1166)
    typedef typename conditional<Dest::IsVectorAtCompileTime, Dest, typename Dest::ColXpr>::type ActualDest;

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      EvalToDestAtCompileTime = (ActualDest::InnerStrideAtCompileTime==1),
      ComplexByReal = (NumTraits<LhsScalar>::IsComplex) && (!NumTraits<RhsScalar>::IsComplex),
      MightCannotUseDest = (ActualDest::InnerStrideAtCompileTime!=1) || ComplexByReal
    };

    gemv_static_vector_if<ResScalar,ActualDest::SizeAtCompileTime,ActualDest::MaxSizeAtCompileTime,MightCannotUseDest> static_dest;

    bool alphaIsCompatible = (!ComplexByReal) || (numext::imag(actualAlpha)==RealScalar(0));
    bool evalToDest = EvalToDestAtCompileTime && alphaIsCompatible;
    
    RhsScalar compatibleAlpha = get_factor<ResScalar,RhsScalar>::run(actualAlpha);

    ei_declare_aligned_stack_constructed_variable(ResScalar,actualDestPtr,dest.size(),
                                                  evalToDest ? dest.data() : static_dest.data());
    
    if(!evalToDest)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      int size = dest.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      if(!alphaIsCompatible)
      {
        MappedDest(actualDestPtr, dest.size()).setZero();
        compatibleAlpha = RhsScalar(1);
      }
      else
        MappedDest(actualDestPtr, dest.size()) = dest;
    }

    general_matrix_vector_product
      <Index,LhsScalar,ColMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        actualLhs.data(), actualLhs.outerStride(),
        actualRhs.data(), actualRhs.innerStride(),
        actualDestPtr, 1,
        compatibleAlpha);

    if (!evalToDest)
    {
      if(!alphaIsCompatible)
        dest += actualAlpha * MappedDest(actualDestPtr, dest.size());
      else
        dest = MappedDest(actualDestPtr, dest.size());
    }
  }